

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ld_sampler.cpp
# Opt level: O1

__m256 * __thiscall
LDSampler::sample(__m256 *__return_storage_ptr__,LDSampler *this,mt19937 *rng,Vec2f_8 *samples)

{
  float *__param;
  undefined1 auVar1 [32];
  float fVar2;
  int iVar3;
  mt19937 *pmVar4;
  float fVar5;
  int iVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar9 [16];
  undefined1 in_ZMM4 [64];
  float x [8];
  float y [8];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  float local_80 [20];
  
  fVar2 = (float)((int)(*__return_storage_ptr__)[1] + (int)(*__return_storage_ptr__)[4]);
  pmVar4 = (mt19937 *)(ulong)(uint)fVar2;
  if ((*__return_storage_ptr__)[6] != fVar2) {
    local_a0 = 0xbf800000bf800000;
    uStack_98 = 0xbf800000bf800000;
    uStack_90 = 0xbf800000bf800000;
    uStack_88 = 0xbf800000bf800000;
    local_80[0] = -1.0;
    local_80[1] = -1.0;
    local_80[2] = -1.0;
    local_80[3] = -1.0;
    local_80[4] = -1.0;
    local_80[5] = -1.0;
    local_80[6] = -1.0;
    local_80[7] = -1.0;
    iVar6 = (int)(*__return_storage_ptr__)[0] - (int)(*__return_storage_ptr__)[2];
    iVar3 = 8;
    if (iVar6 < 8) {
      iVar3 = iVar6;
    }
    __param = *__return_storage_ptr__ + 7;
    auVar8 = in_ZMM3._0_16_;
    auVar9 = in_ZMM4._0_16_;
    std::uniform_int_distribution<unsigned_int>::operator()
              ((uniform_int_distribution<unsigned_int> *)__param,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)this,(param_type *)__param);
    std::uniform_int_distribution<unsigned_int>::operator()
              ((uniform_int_distribution<unsigned_int> *)__param,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)this,(param_type *)__param);
    if (0 < iVar6) {
      halt_baddata();
    }
    std::
    shuffle<float*,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((float *)&local_a0,(float *)((long)&local_a0 + (long)iVar3 * 4),
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)this);
    std::
    shuffle<float*,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              (local_80,local_80 + iVar3,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)this);
    auVar1._8_8_ = uStack_98;
    auVar1._0_8_ = local_a0;
    auVar1._16_8_ = uStack_90;
    auVar1._24_8_ = uStack_88;
    *(undefined1 (*) [32])rng->_M_x = auVar1;
    *(float *)(rng->_M_x + 4) = local_80[0];
    *(float *)((long)rng->_M_x + 0x24) = local_80[1];
    *(float *)(rng->_M_x + 5) = local_80[2];
    *(float *)((long)rng->_M_x + 0x2c) = local_80[3];
    *(float *)(rng->_M_x + 6) = local_80[4];
    *(float *)((long)rng->_M_x + 0x34) = local_80[5];
    *(float *)(rng->_M_x + 7) = local_80[6];
    *(float *)((long)rng->_M_x + 0x3c) = local_80[7];
    auVar7._8_4_ = 0xbf000000;
    auVar7._0_8_ = 0xbf000000bf000000;
    auVar7._12_4_ = 0xbf000000;
    auVar7._16_4_ = 0xbf000000;
    auVar7._20_4_ = 0xbf000000;
    auVar7._24_4_ = 0xbf000000;
    auVar7._28_4_ = 0xbf000000;
    vcmpps_avx(auVar7,auVar1,1);
    auVar8 = vcvtusi2ss_avx512f(auVar8,(*__return_storage_ptr__)[5]);
    auVar9 = vcvtusi2ss_avx512f(auVar9,(*__return_storage_ptr__)[6]);
    fVar2 = auVar8._0_4_;
    fVar5 = auVar9._0_4_;
    *(float *)rng->_M_x = (float)local_a0 + fVar2;
    *(float *)((long)rng->_M_x + 4) = (float)((ulong)local_a0 >> 0x20) + fVar2;
    *(float *)(rng->_M_x + 1) = (float)uStack_98 + fVar2;
    *(float *)((long)rng->_M_x + 0xc) = (float)((ulong)uStack_98 >> 0x20) + fVar2;
    *(float *)(rng->_M_x + 2) = (float)uStack_90 + fVar2;
    *(float *)((long)rng->_M_x + 0x14) = (float)((ulong)uStack_90 >> 0x20) + fVar2;
    *(float *)(rng->_M_x + 3) = (float)uStack_88 + fVar2;
    *(float *)((long)rng->_M_x + 0x1c) = (float)((ulong)uStack_88 >> 0x20) + fVar2;
    *(float *)(rng->_M_x + 4) = local_80[0] + fVar5;
    *(float *)((long)rng->_M_x + 0x24) = local_80[1] + fVar5;
    *(float *)(rng->_M_x + 5) = local_80[2] + fVar5;
    *(float *)((long)rng->_M_x + 0x2c) = local_80[3] + fVar5;
    *(float *)(rng->_M_x + 6) = local_80[4] + fVar5;
    *(float *)((long)rng->_M_x + 0x34) = local_80[5] + fVar5;
    *(float *)(rng->_M_x + 7) = local_80[6] + fVar5;
    *(float *)((long)rng->_M_x + 0x3c) = local_80[7] + fVar5;
    fVar2 = (float)(iVar3 + (int)(*__return_storage_ptr__)[2]);
    (*__return_storage_ptr__)[2] = fVar2;
    pmVar4 = rng;
    if ((uint)(*__return_storage_ptr__)[0] <= (uint)fVar2) {
      (*__return_storage_ptr__)[2] = 0.0;
      fVar2 = (*__return_storage_ptr__)[3];
      pmVar4 = (mt19937 *)(ulong)(uint)fVar2;
      fVar5 = (float)((int)(*__return_storage_ptr__)[5] + 1);
      (*__return_storage_ptr__)[5] = fVar5;
      if (fVar5 == (float)((int)(*__return_storage_ptr__)[1] + (int)fVar2)) {
        (*__return_storage_ptr__)[5] = fVar2;
        (*__return_storage_ptr__)[6] = (float)((int)(*__return_storage_ptr__)[6] + 1);
      }
    }
  }
  return (__m256 *)pmVar4;
}

Assistant:

__m256 LDSampler::sample(std::mt19937 &rng, Vec2f_8 &samples){
	if (!has_samples()){
		return _mm256_set1_ps(0.f);
	}
	CACHE_ALIGN float x[8] = {-1, -1, -1, -1, -1, -1, -1, -1};
	CACHE_ALIGN float y[8] = {-1, -1, -1, -1, -1, -1, -1, -1};

	// Take at most 8 samples per sampling pass since that's how many we can
	// fit into a packet
	int n = spp - samples_taken;
	if (n > 8){
		n = 8;
	}
	sample2d(n, distrib(rng), distrib(rng), x, y, samples_taken);
	std::shuffle(x, x + n, rng);
	std::shuffle(y, y + n, rng);
	samples.x = _mm256_load_ps(x);
	samples.y = _mm256_load_ps(y);
	// We use -1 to signal that there is no sample to be taken for the lane, so
	// compute mask of those samples which shouldn't be used
	const auto active = _mm256_cmp_ps(samples.x, _mm256_set1_ps(-0.5f), _CMP_GT_OQ);
	samples += Vec2f_8{static_cast<float>(current.first), static_cast<float>(current.second)};

	samples_taken += n;
	// We're done sampling this pixel, move to the next one
	if (samples_taken >= spp){
		samples_taken = 0;
		++current.first;
		if (current.first == start.first + block_dim){
			current.first = start.first;
			++current.second;
		}
	}
	return active;
}